

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteorder.c
# Opt level: O0

BOOL has_tok_dollar_reg(List *ls,int number)

{
  BOOL BVar1;
  bool local_1d;
  int number_local;
  List *ls_local;
  
  if (ls == (List *)0x0) {
    ls_local._4_4_ = FALSE;
  }
  else if (((((ls->token).type == TOK_DOLLAR_DATA_REGISTER) ||
            ((ls->token).type == TOK_DOLLAR_ADDRESS_REGISTER)) ||
           ((ls->token).type == TOK_DOLLAR_GENERAL_REGISTER)) &&
          ((uint)(ls->token).u.reginfo.which == number)) {
    ls_local._4_4_ = TRUE;
  }
  else {
    BVar1 = has_tok_dollar_reg(ls->car,number);
    local_1d = true;
    if (BVar1 == FALSE) {
      BVar1 = has_tok_dollar_reg(ls->cdr,number);
      local_1d = BVar1 != FALSE;
    }
    ls_local._4_4_ = (BOOL)local_1d;
  }
  return ls_local._4_4_;
}

Assistant:

static BOOL
has_tok_dollar_reg (List *ls, int number)
{
  if (ls == NULL)
    return FALSE;
  if ((ls->token.type == TOK_DOLLAR_DATA_REGISTER
       || ls->token.type == TOK_DOLLAR_ADDRESS_REGISTER
       || ls->token.type == TOK_DOLLAR_GENERAL_REGISTER)
      && ls->token.u.dollarinfo.which == number)
    return TRUE;
  return (has_tok_dollar_reg (ls->car, number)
	  || has_tok_dollar_reg (ls->cdr, number));
}